

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O1

void __thiscall
TPZFNMatrix<3,_Fad<float>_>::TPZFNMatrix
          (TPZFNMatrix<3,_Fad<float>_> *this,int64_t row,int64_t col,Fad<float> *val)

{
  uint uVar1;
  ulong uVar2;
  Fad<float> *buf;
  long lVar3;
  Fad<float> local_48;
  
  (this->super_TPZFMatrix<Fad<float>_>).super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_01875d78;
  buf = this->fBuf;
  TPZFMatrix<Fad<float>_>::TPZFMatrix
            (&this->super_TPZFMatrix<Fad<float>_>,&PTR_PTR_01876030,row,col,buf,3);
  (this->super_TPZFMatrix<Fad<float>_>).super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_01875d78;
  lVar3 = 0;
  do {
    Fad<float>::Fad(buf);
    lVar3 = lVar3 + -0x20;
    buf = buf + 1;
  } while (lVar3 != -0x80);
  local_48.val_ = val->val_;
  uVar1 = (val->dx_).num_elts;
  local_48.dx_.ptr_to_data = (float *)0x0;
  local_48.dx_.num_elts = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar2 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar2 = (long)(int)uVar1 * 4;
    }
    local_48.dx_.ptr_to_data = (float *)operator_new__(uVar2);
    MEM_CPY<float>::copy
              ((MEM_CPY<float> *)local_48.dx_.ptr_to_data,(EVP_PKEY_CTX *)(val->dx_).ptr_to_data,
               (EVP_PKEY_CTX *)(ulong)uVar1);
  }
  local_48.defaultVal = val->defaultVal;
  TPZFMatrix<Fad<float>_>::operator=(&this->super_TPZFMatrix<Fad<float>_>,&local_48);
  Fad<float>::~Fad(&local_48);
  return;
}

Assistant:

inline  TPZFNMatrix(int64_t row, int64_t col, const TVar &val) : TPZRegisterClassId(&TPZFNMatrix<N,TVar>::ClassId), 
    TPZFMatrix<TVar>(row,col,fBuf,N) {
        TPZFMatrix<TVar>::operator=(val);
    }